

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

void scale_flux(vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_rev,uint64_t numerator,
               uint64_t denominator)

{
  bool bVar1;
  reference puVar2;
  uint64_t new_target;
  uint *time;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint64_t new_total;
  uint64_t old_total;
  uint64_t denominator_local;
  uint64_t numerator_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_rev_local;
  
  new_total = 0;
  __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(flux_rev);
  time = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(flux_rev);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&time);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    new_total = *puVar2 + new_total;
    *puVar2 = (int)((new_total * numerator) / denominator) - (int)__range1;
    __range1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(__range1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + (ulong)*puVar2);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void scale_flux(std::vector<uint32_t>& flux_rev, uint64_t numerator, uint64_t denominator)
{
    uint64_t old_total = 0, new_total = 0;
    for (auto& time : flux_rev)
    {
        old_total += time;
        auto new_target = old_total * numerator / denominator;
        time = static_cast<uint32_t>(new_target - new_total);
        new_total += time;
    }
}